

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O3

BOOL __thiscall
Js::CustomExternalWrapperObject::GetPropertyDescriptorTrap
          (CustomExternalWrapperObject *this,PropertyId propertyId,
          PropertyDescriptor *resultDescriptor,ScriptContext *requestContext)

{
  byte bVar1;
  ScriptContext *scriptContext;
  DynamicObject *aValue;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  Attributes attributes;
  int iVar5;
  JavascriptFunction *function;
  Type *pTVar6;
  Var pvVar7;
  undefined4 *puVar8;
  JavascriptMethod p_Var9;
  RecyclableObject *ptr;
  RecyclableObject *this_00;
  Type typeId;
  Var pvVar10;
  Recycler *this_01;
  PropertyDescriptor *pPVar11;
  Var local_78;
  Var value;
  PropertyDescriptor *local_68;
  RecyclableObject *local_60;
  Var local_58;
  RecyclableObject *local_50;
  Var isPropertyNameNumeric;
  Var propertyNameNumericValue;
  undefined1 local_31;
  
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  local_68 = resultDescriptor;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  propertyNameNumericValue = requestContext->threadContext;
  BVar4 = EnsureInitialized(this,requestContext);
  if (BVar4 == 0) {
    return 0;
  }
  pTVar6 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  aValue = (pTVar6[1].propertyCache.ptr)->elements[3].prototypeObjectWithProperty.ptr;
  if (aValue == (DynamicObject *)0x0) {
    function = (JavascriptFunction *)0x0;
  }
  else {
    function = VarTo<Js::JavascriptFunction>(aValue);
    pTVar6 = (this->super_DynamicObject).super_RecyclableObject.type.ptr;
  }
  this_01 = ((((pTVar6->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
            recycler;
  bVar3 = Memory::Recycler::IsHeapEnumInProgress(this_01);
  if (bVar3) {
    return 0;
  }
  if (function == (JavascriptFunction *)0x0) {
    BVar4 = JavascriptOperators::GetOwnAccessors
                      (this,propertyId,&local_50,&isPropertyNameNumeric,requestContext);
    pPVar11 = local_68;
    if (BVar4 == 0) {
      local_78 = (Var)0x0;
      BVar4 = JavascriptOperators::GetOwnProperty
                        (this,propertyId,&local_78,requestContext,(PropertyValueInfo *)0x0);
      pPVar11 = local_68;
      if (BVar4 == 0) {
        return 0;
      }
      if (local_78 != (Var)0x0) {
        PropertyDescriptor::SetValue(local_68,local_78);
      }
      iVar5 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
                super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x30])(this,propertyId);
      PropertyDescriptor::SetWritable(pPVar11,iVar5 != 0);
    }
    else {
      if (local_50 == (RecyclableObject *)0x0) {
        local_50 = (((requestContext->super_ScriptContextBase).javascriptLibrary)->
                   super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      PropertyDescriptor::SetGetter(local_68,local_50);
      if (isPropertyNameNumeric == (Var)0x0) {
        isPropertyNameNumeric =
             (((requestContext->super_ScriptContextBase).javascriptLibrary)->
             super_JavascriptLibraryBase).undefinedValue.ptr;
      }
      PropertyDescriptor::SetSetter(pPVar11,isPropertyNameNumeric);
    }
    iVar5 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x31])(this,propertyId);
    PropertyDescriptor::SetConfigurable(pPVar11,iVar5 != 0);
    iVar5 = (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
              super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x32])(this,propertyId);
    PropertyDescriptor::SetEnumerable(pPVar11,iVar5 != 0);
    return 1;
  }
  pvVar7 = GetName((CustomExternalWrapperObject *)this_01,requestContext,propertyId,&local_50,
                   &isPropertyNameNumeric);
  bVar3 = VarIs<Js::JavascriptString>(pvVar7);
  if ((!bVar3) && (bVar3 = VarIs<Js::JavascriptSymbol>(pvVar7), !bVar3)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                ,0x1e1,
                                "(Js::VarIs<JavascriptString>(propertyName) || Js::VarIs<JavascriptSymbol>(propertyName))"
                                ,
                                "Js::VarIs<JavascriptString>(propertyName) || Js::VarIs<JavascriptSymbol>(propertyName)"
                               );
    if (!bVar3) goto LAB_00b31260;
    *puVar8 = 0;
  }
  pvVar10 = propertyNameNumericValue;
  local_60 = local_50;
  local_58 = isPropertyNameNumeric;
  local_31 = *(undefined1 *)((long)propertyNameNumericValue + 0x109);
  *(undefined1 *)((long)propertyNameNumericValue + 0x109) = 1;
  value = pvVar7;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar3 = ThreadContext::HasNoSideEffect
                    ((ThreadContext *)pvVar10,(RecyclableObject *)function,attributes);
  pvVar10 = propertyNameNumericValue;
  pvVar7 = value;
  if (bVar3) {
    ThreadContext::CheckAndResetReentrancySafeOrHandled((ThreadContext *)propertyNameNumericValue);
    pvVar7 = value;
    if (*(char *)((long)pvVar10 + 0x108) == '\x01') {
      Throw::FatalJsReentrancyError();
    }
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var9);
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var9)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,0x2000004,this
                    ,pvVar7,local_60,local_58);
    bVar3 = ThreadContext::IsOnStack(ptr);
LAB_00b30de3:
    if (bVar3 != false) {
      *(byte *)((long)pvVar10 + 0x1570) = *(byte *)((long)pvVar10 + 0x1570) | 5;
    }
  }
  else if ((*(byte *)((long)propertyNameNumericValue + 0x1542) & 1) == 0) {
    if ((attributes & HasNoSideEffect) != None) {
      ThreadContext::CheckAndResetReentrancySafeOrHandled((ThreadContext *)propertyNameNumericValue)
      ;
      if (*(char *)((long)pvVar10 + 0x108) == '\x01') {
        Throw::FatalJsReentrancyError();
      }
      p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      CheckIsExecutable((RecyclableObject *)function,p_Var9);
      p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
      ptr = (RecyclableObject *)
            (*p_Var9)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,0x2000004,
                      this,pvVar7,local_60,local_58);
      bVar3 = ThreadContext::IsOnStack(ptr);
      goto LAB_00b30de3;
    }
    bVar1 = *(byte *)((long)propertyNameNumericValue + 0x1570);
    ThreadContext::CheckAndResetReentrancySafeOrHandled((ThreadContext *)propertyNameNumericValue);
    if (*(char *)((long)propertyNameNumericValue + 0x108) == '\x01') {
      Throw::FatalJsReentrancyError();
    }
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    CheckIsExecutable((RecyclableObject *)function,p_Var9);
    p_Var9 = RecyclableObject::GetEntryPoint((RecyclableObject *)function);
    ptr = (RecyclableObject *)
          (*p_Var9)((RecyclableObject *)function,(CallInfo)function,0x2000004,0,0,0,0,0x2000004,this
                    ,pvVar7,local_60,local_58);
    *(byte *)((long)propertyNameNumericValue + 0x1570) = bVar1 | 5;
    pvVar10 = propertyNameNumericValue;
  }
  else {
    *(byte *)((long)propertyNameNumericValue + 0x1570) =
         *(byte *)((long)propertyNameNumericValue + 0x1570) | 5;
    ptr = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
            super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).undefinedValue
          .ptr;
  }
  *(undefined1 *)((long)pvVar10 + 0x109) = local_31;
  if (ptr == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar3) goto LAB_00b31260;
    *puVar8 = 0;
LAB_00b31016:
    this_00 = UnsafeVarTo<Js::RecyclableObject>(ptr);
    if (this_00 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar3) goto LAB_00b31260;
      *puVar8 = 0;
    }
    typeId = ((this_00->type).ptr)->typeId;
    if (((int)typeId < 0x58) || (BVar4 = RecyclableObject::IsExternal(this_00), BVar4 != 0))
    goto LAB_00b3110a;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                "GetTypeId aValue has invalid TypeId");
    if (!bVar3) {
LAB_00b31260:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
  }
  else {
    if (((ulong)ptr & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)ptr & 0xffff000000000000) != 0x1000000000000) {
      typeId = TypeIds_FirstNumberType;
      if ((((ulong)ptr & 0xffff000000000000) == 0x1000000000000) ||
         (typeId = TypeIds_Number, (ulong)ptr >> 0x32 != 0)) goto LAB_00b3110a;
      goto LAB_00b31016;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar3) goto LAB_00b31260;
    typeId = TypeIds_FirstNumberType;
  }
  *puVar8 = 0;
LAB_00b3110a:
  bVar3 = StaticType::Is(typeId);
  pPVar11 = local_68;
  if (typeId == TypeIds_Undefined || !bVar3) {
    BVar4 = JavascriptOperators::ToPropertyDescriptor(ptr,local_68,requestContext);
    JavascriptOperators::CompletePropertyDescriptor
              (pPVar11,(PropertyDescriptor *)0x0,requestContext);
    return BVar4;
  }
  JavascriptError::ThrowTypeError(requestContext,-0x7ff5ec71,L"getOwnPropertyDescriptor");
}

Assistant:

BOOL CustomExternalWrapperObject::GetPropertyDescriptorTrap(Js::PropertyId propertyId, Js::PropertyDescriptor* resultDescriptor, Js::ScriptContext* requestContext)
{
    PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

    ThreadContext* threadContext = requestContext->GetThreadContext();

    if (!this->EnsureInitialized(requestContext))
    {
        return FALSE;
    }

    Js::RecyclableObject * targetObj = this;

    CustomExternalWrapperType * type = this->GetExternalType();
    Js::JavascriptFunction* gOPDMethod = nullptr;
    if (type->GetJsGetterSetterInterceptor()->getOwnPropertyDescriptorTrap != nullptr)
    {
        gOPDMethod = Js::VarTo<JavascriptFunction>(type->GetJsGetterSetterInterceptor()->getOwnPropertyDescriptorTrap);
    }

    if (GetScriptContext()->IsHeapEnumInProgress())
    {
        return FALSE;
    }

    if (nullptr == gOPDMethod)
    {
        Var getter, setter;
        if (false == JavascriptOperators::GetOwnAccessors(this, propertyId, &getter, &setter, requestContext))
        {
            Var value = nullptr;
            if (false == JavascriptOperators::GetOwnProperty(this, propertyId, &value, requestContext, nullptr))
            {
                return FALSE;
            }
            if (nullptr != value)
            {
                resultDescriptor->SetValue(value);
            }

            resultDescriptor->SetWritable(FALSE != this->IsWritable(propertyId));
        }
        else
        {
            if (nullptr == getter)
            {
                getter = requestContext->GetLibrary()->GetUndefined();
            }
            resultDescriptor->SetGetter(getter);

            if (nullptr == setter)
            {
                setter = requestContext->GetLibrary()->GetUndefined();
            }
            resultDescriptor->SetSetter(setter);
        }

        resultDescriptor->SetConfigurable(FALSE != this->IsConfigurable(propertyId));
        resultDescriptor->SetEnumerable(FALSE != this->IsEnumerable(propertyId));
        return TRUE;
    }

    Js::Var isPropertyNameNumeric;
    Js::Var propertyNameNumericValue;
    Js::Var propertyName = GetName(requestContext, propertyId, &isPropertyNameNumeric, &propertyNameNumericValue);

    Assert(Js::VarIs<JavascriptString>(propertyName) || Js::VarIs<JavascriptSymbol>(propertyName));

    Js::Var getResult = threadContext->ExecuteImplicitCall(gOPDMethod, Js::ImplicitCall_Accessor, [=]()->Js::Var
    {
        return CALL_FUNCTION(threadContext, gOPDMethod, Js::CallInfo(Js::CallFlags_Value, 4), targetObj, propertyName, isPropertyNameNumeric, propertyNameNumericValue);
    });

    Js::TypeId getResultTypeId = Js::JavascriptOperators::GetTypeId(getResult);
    if (Js::StaticType::Is(getResultTypeId) && getResultTypeId != Js::TypeIds_Undefined)
    {
        Js::JavascriptError::ThrowTypeError(requestContext, JSERR_NeedObject, _u("getOwnPropertyDescriptor"));
    }

    BOOL toProperty = Js::JavascriptOperators::ToPropertyDescriptor(getResult, resultDescriptor, requestContext);
    Js::JavascriptOperators::CompletePropertyDescriptor(resultDescriptor, nullptr, requestContext);
    return toProperty;
}